

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

bool TestEncoders(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte mask;
  uint8_t uVar5;
  byte bVar6;
  int iVar7;
  int32_t iVar8;
  int iVar9;
  ostream *poVar10;
  void *pvVar11;
  bool local_1b1;
  uint8_t index;
  uint8_t chanB;
  uint8_t dout_mask;
  uint8_t chanA;
  bool directPass;
  unsigned_long expected_1;
  bool tmp_pass;
  unsigned_long expected;
  uint8_t enc_mask;
  int encStart;
  bool tmpFix;
  bool pass;
  char buf [250];
  char numStr [4] [3];
  unsigned_long testValue [4];
  unsigned_long darray [4];
  int local_30;
  int j;
  int i;
  uint qlaNum_local;
  ofstream *logFile_local;
  BasePort *Port_local;
  AmpIO *Board_local;
  int curLine_local;
  
  numStr[0][0] = '\0';
  numStr[0][1] = ' ';
  numStr[0][2] = '4';
  numStr[1][0] = '\0';
  bVar1 = true;
  iVar7 = 0;
  if (qlaNum == 2) {
    iVar7 = 4;
  }
  mask = 0xf;
  if (qlaNum == 2) {
    mask = 0xf0;
  }
  poVar10 = (ostream *)std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<(poVar10,"=== ENCODER INPUTS ===");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  Amp1394Console::Print
            (curLine,9,
             "This test uses the DOUT signals to generate a known number of quadrature encoder signals"
            );
  AmpIO::WriteDigitalOutput(Board,mask,'3');
  std::operator<<((ostream *)logFile,"   Preload to 0x000000: ");
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    AmpIO::WriteEncoderPreload(Board,iVar7 + local_30,0);
  }
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    iVar8 = AmpIO::GetEncoderPosition(Board,iVar7 + local_30);
    testValue[(long)local_30 + 3] = (long)iVar8;
    pvVar11 = (void *)std::ostream::operator<<(logFile,std::hex);
    poVar10 = (ostream *)std::ostream::operator<<(pvVar11,testValue[(long)local_30 + 3]);
    std::operator<<(poVar10," ");
    if (testValue[(long)local_30 + 3] != 0) {
      bVar1 = false;
    }
  }
  if (bVar1 == false) {
    poVar10 = std::operator<<((ostream *)logFile,"- FAIL");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&encStart,"Set encoder preload to 0 - FAIL (%06lx %06lx %06lx %06lx)",
            testValue[3],darray[0],darray[1],darray[2]);
  }
  else {
    poVar10 = std::operator<<((ostream *)logFile,"- PASS");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&encStart,"Set encoder preload to 0 - PASS");
  }
  iVar9 = curLine + 2;
  Amp1394Console::Print(curLine + 1,9,(char *)&encStart);
  Amp1394Console::Refresh();
  Board_local._4_4_ = iVar9;
  if (bVar1 != false) {
    poVar10 = std::operator<<((ostream *)logFile,"   Increment to 0x000100:");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    Amp1394Console::Print(iVar9,9,"Testing encoder increment to 0x000100 -");
    bVar3 = false;
    for (darray[3]._4_4_ = 0; darray[3]._4_4_ < 4; darray[3]._4_4_ = darray[3]._4_4_ + 1) {
      testValue[(long)darray[3]._4_4_ + -1] = 0;
    }
    local_30 = 0;
    while( true ) {
      bVar2 = false;
      if (local_30 < 0x40) {
        bVar2 = bVar1;
      }
      if (bVar2 == false) break;
      EncUp(Board,qlaNum);
      Amp1394_Sleep(0.0001);
      std::operator<<((ostream *)logFile,"      ");
      (*Port->_vptr_BasePort[0x1d])();
      for (darray[3]._4_4_ = 0; darray[3]._4_4_ < 4; darray[3]._4_4_ = darray[3]._4_4_ + 1) {
        iVar8 = AmpIO::GetEncoderPosition(Board,iVar7 + darray[3]._4_4_);
        testValue[(long)darray[3]._4_4_ + 3] = (long)iVar8;
        std::ostream::operator<<(logFile,testValue[(long)darray[3]._4_4_ + 3]);
        if (testValue[(long)darray[3]._4_4_ + 3] ==
            testValue[(long)darray[3]._4_4_ + -1] + (long)((local_30 + 1) * 4)) {
          std::operator<<((ostream *)logFile,"  ");
        }
        else if (local_30 == 0) {
          std::operator<<((ostream *)logFile,"  ");
          testValue[(long)darray[3]._4_4_ + -1] = testValue[(long)darray[3]._4_4_ + 3] - 4;
          bVar3 = true;
        }
        else {
          std::operator<<((ostream *)logFile,"* ");
          bVar1 = false;
        }
      }
      std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
      local_30 = local_30 + 1;
    }
    if (bVar1 == false) {
      poVar10 = std::operator<<((ostream *)logFile,"   Increment result - FAIL");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      sprintf((char *)&encStart,"FAIL at %06lx (%06lx %06lx %06lx %06lx)",
              (long)(local_30 << 2) + 0x800000,testValue[3],darray[0],darray[1],darray[2]);
    }
    else {
      poVar10 = std::operator<<((ostream *)logFile,"   Increment result - PASS");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      sprintf((char *)&encStart,"PASS");
      if (bVar3) {
        strcat((char *)&encStart," (adjusted");
        for (darray[3]._4_4_ = 0; darray[3]._4_4_ < 4; darray[3]._4_4_ = darray[3]._4_4_ + 1) {
          if (testValue[(long)darray[3]._4_4_ + -1] != 0x800000) {
            strcat((char *)&encStart,numStr[(long)darray[3]._4_4_ + -3] + 1);
          }
        }
        strcat((char *)&encStart,")");
      }
    }
    Board_local._4_4_ = curLine + 3;
    Amp1394Console::Print(iVar9,0x31,(char *)&encStart);
    Amp1394Console::Refresh();
  }
  bVar3 = true;
  std::operator<<((ostream *)logFile,"   Preload to 0x000100: ");
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    AmpIO::WriteEncoderPreload(Board,iVar7 + local_30,0x100);
  }
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    iVar8 = AmpIO::GetEncoderPosition(Board,iVar7 + local_30);
    testValue[(long)local_30 + 3] = (long)iVar8;
    pvVar11 = (void *)std::ostream::operator<<(logFile,std::hex);
    poVar10 = (ostream *)std::ostream::operator<<(pvVar11,testValue[(long)local_30 + 3]);
    std::operator<<(poVar10," ");
    if (testValue[(long)local_30 + 3] != 0x100) {
      bVar3 = false;
    }
  }
  if (bVar3) {
    poVar10 = std::operator<<((ostream *)logFile,"- PASS");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&encStart,"Set encoder preload to 0x000100 - PASS");
  }
  else {
    poVar10 = std::operator<<((ostream *)logFile,"- FAIL");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    sprintf((char *)&encStart,"Set encoder preload to 0x000100 - FAIL (%06lx %06lx %06lx %06lx)",
            testValue[3],darray[0],darray[1],darray[2]);
    bVar1 = false;
  }
  iVar9 = Board_local._4_4_ + 1;
  Amp1394Console::Print(Board_local._4_4_,9,(char *)&encStart);
  Amp1394Console::Refresh();
  if (bVar3) {
    poVar10 = std::operator<<((ostream *)logFile,"   Decrement to 0x000000:");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    Amp1394Console::Print(iVar9,9,"Testing encoder decrement to 0x000000 -");
    bVar2 = false;
    for (darray[3]._4_4_ = 0; darray[3]._4_4_ < 4; darray[3]._4_4_ = darray[3]._4_4_ + 1) {
      testValue[(long)darray[3]._4_4_ + -1] = 0;
    }
    local_30 = 0x3f;
    while( true ) {
      bVar4 = false;
      if (-1 < local_30) {
        bVar4 = bVar3;
      }
      if (!bVar4) break;
      EncDown(Board,qlaNum);
      Amp1394_Sleep(0.0001);
      std::operator<<((ostream *)logFile,"      ");
      (*Port->_vptr_BasePort[0x1d])();
      for (darray[3]._4_4_ = 0; darray[3]._4_4_ < 4; darray[3]._4_4_ = darray[3]._4_4_ + 1) {
        iVar8 = AmpIO::GetEncoderPosition(Board,iVar7 + darray[3]._4_4_);
        testValue[(long)darray[3]._4_4_ + 3] = (long)iVar8;
        pvVar11 = (void *)std::ostream::operator<<(logFile,std::hex);
        std::ostream::operator<<(pvVar11,testValue[(long)darray[3]._4_4_ + 3]);
        if (testValue[(long)darray[3]._4_4_ + 3] ==
            testValue[(long)darray[3]._4_4_ + -1] + (long)(local_30 << 2)) {
          std::operator<<((ostream *)logFile,"  ");
        }
        else if (local_30 == 0x3f) {
          std::operator<<((ostream *)logFile,"  ");
          testValue[(long)darray[3]._4_4_ + -1] = testValue[(long)darray[3]._4_4_ + 3] - 0xfc;
          bVar2 = true;
        }
        else {
          std::operator<<((ostream *)logFile,"* ");
          bVar3 = false;
        }
      }
      std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
      local_30 = local_30 + -1;
    }
    if (bVar3) {
      poVar10 = std::operator<<((ostream *)logFile,"   Decrement result - PASS");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      sprintf((char *)&encStart,"PASS");
      if (bVar2) {
        strcat((char *)&encStart," (adjusted");
        for (darray[3]._4_4_ = 0; darray[3]._4_4_ < 4; darray[3]._4_4_ = darray[3]._4_4_ + 1) {
          if (testValue[(long)darray[3]._4_4_ + -1] != 0) {
            strcat((char *)&encStart,numStr[(long)darray[3]._4_4_ + -3] + 1);
          }
        }
        strcat((char *)&encStart,")");
      }
    }
    else {
      poVar10 = std::operator<<((ostream *)logFile,"   Decrement result - FAIL");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      bVar1 = false;
      sprintf((char *)&encStart,"FAIL at %06lx (%06lx %06lx %06lx %06lx)",(long)((local_30 + 1) * 4)
              ,testValue[3],darray[0],darray[1],darray[2]);
    }
    Amp1394Console::Print(iVar9,0x31,(char *)&encStart);
    Amp1394Console::Refresh();
    iVar9 = Board_local._4_4_ + 2;
  }
  Board_local._4_4_ = iVar9;
  Amp1394Console::Print(Board_local._4_4_,9,"Testing direct encoder input (A,B,I)");
  uVar5 = '\x01';
  if (qlaNum == 2) {
    uVar5 = '\x10';
  }
  AmpIO::WriteDigitalOutput(Board,uVar5,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar6 = AmpIO::GetEncoderChannelA(Board);
  local_1b1 = (bVar6 & mask) != 0;
  if (local_1b1) {
    poVar10 = std::operator<<((ostream *)logFile,"   Setting channel A = 0, FAIL: ");
    pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
    pvVar11 = (void *)std::ostream::operator<<(pvVar11,(uint)bVar6);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    bVar1 = false;
  }
  local_1b1 = !local_1b1;
  AmpIO::WriteDigitalOutput(Board,uVar5,uVar5);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar6 = AmpIO::GetEncoderChannelA(Board);
  if ((bVar6 & mask) != mask) {
    poVar10 = std::operator<<((ostream *)logFile,"   Setting channel A = 1, FAIL: ");
    pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
    pvVar11 = (void *)std::ostream::operator<<(pvVar11,(uint)bVar6);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    local_1b1 = false;
    bVar1 = false;
  }
  uVar5 = '\x02';
  if (qlaNum == 2) {
    uVar5 = ' ';
  }
  AmpIO::WriteDigitalOutput(Board,uVar5,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar6 = AmpIO::GetEncoderChannelB(Board);
  if ((bVar6 & mask) != 0) {
    poVar10 = std::operator<<((ostream *)logFile,"   Setting channel B = 0, FAIL: ");
    pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
    pvVar11 = (void *)std::ostream::operator<<(pvVar11,(uint)bVar6);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    local_1b1 = false;
    bVar1 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar5,uVar5);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar6 = AmpIO::GetEncoderChannelB(Board);
  if ((bVar6 & mask) != mask) {
    poVar10 = std::operator<<((ostream *)logFile,"   Setting channel B = 1, FAIL: ");
    pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
    pvVar11 = (void *)std::ostream::operator<<(pvVar11,(uint)bVar6);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    local_1b1 = false;
    bVar1 = false;
  }
  uVar5 = '\x04';
  if (qlaNum == 2) {
    uVar5 = '@';
  }
  AmpIO::WriteDigitalOutput(Board,uVar5,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar6 = AmpIO::GetEncoderIndex(Board);
  if ((bVar6 & mask) != 0) {
    poVar10 = std::operator<<((ostream *)logFile,"   Setting index = 0, FAIL: ");
    pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
    pvVar11 = (void *)std::ostream::operator<<(pvVar11,(uint)bVar6);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    local_1b1 = false;
    bVar1 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar5,uVar5);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar6 = AmpIO::GetEncoderIndex(Board);
  if ((bVar6 & mask) != mask) {
    poVar10 = std::operator<<((ostream *)logFile,"   Setting index = 1, FAIL: ");
    pvVar11 = (void *)std::ostream::operator<<(poVar10,std::hex);
    pvVar11 = (void *)std::ostream::operator<<(pvVar11,(uint)bVar6);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    local_1b1 = false;
    bVar1 = false;
  }
  if (local_1b1) {
    Amp1394Console::Print(Board_local._4_4_,0x31,"- PASS");
  }
  else {
    Amp1394Console::Print(Board_local._4_4_,0x31,"- FAIL");
  }
  if (bVar1 == false) {
    poVar10 = std::operator<<((ostream *)logFile,"   Overall result: FAIL");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar10 = std::operator<<((ostream *)logFile,"   Overall result: PASS");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  return bVar1;
}

Assistant:

bool TestEncoders(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    int i, j;
    unsigned long darray[4];
    unsigned long testValue[4];
    char numStr[4][3] = { " 1", " 2", " 3", " 4" };
    char buf[250];
    bool pass = true;
    bool tmpFix;

    int encStart = (qlaNum == 2) ? 4 : 0;
    uint8_t enc_mask = (qlaNum == 2) ? 0xf0 : 0x0f;

    logFile << std::endl << "=== ENCODER INPUTS ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This test uses the DOUT signals to"
                           " generate a known number of quadrature encoder signals");
    Board.WriteDigitalOutput(enc_mask, 0x33);
    // First, test setting of encoder preload
    logFile << "   Preload to 0x000000: ";
    for (i = 0; i < 4; i++)
        Board.WriteEncoderPreload(encStart+i, 0);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    for (i = 0; i < 4; i++) {
        darray[i] = Board.GetEncoderPosition(encStart+i);
        logFile << std::hex << darray[i] << " ";
        if (darray[i] != 0)
            pass = false;
    }
    if (pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Set encoder preload to 0 - PASS");
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Set encoder preload to 0 - FAIL (%06lx %06lx %06lx %06lx)",
                     darray[0], darray[1], darray[2], darray[3]);
    }
    Amp1394Console::Print(curLine++, 9, buf);
    Amp1394Console::Refresh();
    if (pass) {
        logFile << "   Increment to 0x000100:" << std::endl;
        Amp1394Console::Print(curLine, 9, "Testing encoder increment to 0x000100 -");
        tmpFix = false;
        for (j = 0; j < 4; j++)
            testValue[j] = 0;
        for (i = 0; (i < (0x100/4)) && pass; i++) {
            EncUp(Board, qlaNum);
            Amp1394_Sleep(0.0001);
            logFile << "      ";
            Port->ReadAllBoards();
            for (j = 0; j < 4; j++) {
                darray[j] = Board.GetEncoderPosition(encStart+j);
                logFile << darray[j];
                unsigned long expected = testValue[j]+4*(i+1);
                if (darray[j] != expected) {
                    // There appears to be a problem, where the count
                    // is less than expected after the preload. For now,
                    // we allow this discrepancy and adjust testValue
                    // so that we can continue the test.
                    if (i == 0) {
                        logFile << "  ";
                        testValue[j] = darray[j]-4;
                        tmpFix = true;
                    }
                    else {
                        logFile << "* ";
                        pass = false;
                    }
                }
                else
                    logFile << "  ";
            }
            logFile << std::endl;
        }
        if (pass) {
            logFile << "   Increment result - PASS" << std::endl;
            sprintf(buf, "PASS");
            if (tmpFix) {
                strcat(buf, " (adjusted");
                for (j = 0; j < 4; j++) {
                    if (testValue[j] != 0x800000)
                        strcat(buf, numStr[j]);
                }
                strcat(buf, ")");
            }
        }
        else {
            logFile << "   Increment result - FAIL" << std::endl;
            // Following message could be improved to take testValue into account.
            sprintf(buf, "FAIL at %06lx (%06lx %06lx %06lx %06lx)", 0x800000UL+4*i,
                         darray[0], darray[1], darray[2], darray[3]);
        }
        Amp1394Console::Print(curLine++, 49, buf);
        Amp1394Console::Refresh();
    }
    bool tmp_pass = true;
    logFile << "   Preload to 0x000100: ";
    for (i = 0; i < 4; i++)
        Board.WriteEncoderPreload(encStart+i, 0x000100);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    for (i = 0; i < 4; i++) {
        darray[i] = Board.GetEncoderPosition(encStart+i);
        logFile << std::hex << darray[i] << " ";
        if (darray[i] != 0x000100)
            tmp_pass = false;
    }
    if (tmp_pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Set encoder preload to 0x000100 - PASS");
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Set encoder preload to 0x000100 - FAIL (%06lx %06lx %06lx %06lx)",
                      darray[0], darray[1], darray[2], darray[3]);
        pass = false;
    }
    Amp1394Console::Print(curLine++, 9, buf);
    Amp1394Console::Refresh();

    if (tmp_pass) {
        logFile << "   Decrement to 0x000000:" << std::endl;
        Amp1394Console::Print(curLine, 9, "Testing encoder decrement to 0x000000 -");
        tmpFix = false;
        for (j = 0; j < 4; j++)
            testValue[j] = 0;
        for (i = (0x100/4)-1; (i >= 0) && tmp_pass; i--) {
            EncDown(Board, qlaNum);
            Amp1394_Sleep(0.0001);
            logFile << "      ";
            Port->ReadAllBoards();
            for (j = 0; j < 4; j++) {
                darray[j] = Board.GetEncoderPosition(encStart+j);
                logFile << std::hex << darray[j];
                unsigned long expected = testValue[j] + 4*i;
                if (darray[j] != expected) {
                    // There appears to be a problem, where the count
                    // is less than expected after the preload. For now,
                    // we allow this discrepancy and adjust testValue
                    // so that we can continue the test.
                    if (i == (0x100/4)-1) {
                        logFile << "  ";
                        testValue[j] = darray[j]-0x100+4;
                        tmpFix = true;
                    }
                    else {
                        logFile << "* ";
                        tmp_pass = false;
                    }
                }
                else
                    logFile << "  ";
            }
            logFile << std::endl;
        }
        if (tmp_pass) {
            logFile << "   Decrement result - PASS" << std::endl;
            sprintf(buf, "PASS");
            if (tmpFix) {
                strcat(buf, " (adjusted");
                for (j = 0; j < 4; j++) {
                    if (testValue[j] != 0)
                        strcat(buf, numStr[j]);
                }
                strcat(buf, ")");
            }
        }
        else {
            logFile << "   Decrement result - FAIL" << std::endl;
            pass = false;
            // Following message could be improved to take testValue into account.
            sprintf(buf, "FAIL at %06lx (%06lx %06lx %06lx %06lx)", 0x000000UL+4*(i+1),
                         darray[0], darray[1], darray[2], darray[3]);
        }
        Amp1394Console::Print(curLine++, 49, buf);
        Amp1394Console::Refresh();
    }

    Amp1394Console::Print(curLine, 9, "Testing direct encoder input (A,B,I)");
    bool directPass = true;

    // Test A channel directly
    uint8_t chanA;
    uint8_t dout_mask = (qlaNum == 2) ? 0x10 : 0x01;
    // Channel A low
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanA = Board.GetEncoderChannelA();
    if ((chanA&enc_mask) != 0x00) {
        logFile << "   Setting channel A = 0, FAIL: " << std::hex << (int)chanA << std::endl;
        directPass = false;
        pass = false;
    }
    // Channel A high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanA = Board.GetEncoderChannelA();
    if ((chanA&enc_mask) != enc_mask) {
        logFile << "   Setting channel A = 1, FAIL: " << std::hex << (int)chanA << std::endl;
        directPass = false;
        pass = false;
    }

    // Test B channel directly
    uint8_t chanB;
    dout_mask = (qlaNum == 2) ? 0x20 : 0x02;
    // Channel B low
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanB = Board.GetEncoderChannelB();
    if ((chanB&enc_mask) != 0x00) {
        logFile << "   Setting channel B = 0, FAIL: " << std::hex << (int)chanB << std::endl;
        directPass = false;
        pass = false;
    }
    // Channel B high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanB = Board.GetEncoderChannelB();
    if ((chanB&enc_mask) != enc_mask) {
        logFile << "   Setting channel B = 1, FAIL: " << std::hex << (int)chanB << std::endl;
        directPass = false;
        pass = false;
    }

    // Test index
    // Index low
    uint8_t index;
    dout_mask = (qlaNum == 2) ? 0x40 : 0x04;
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    index = Board.GetEncoderIndex();
    if ((index&enc_mask) != 0x00) {
        logFile << "   Setting index = 0, FAIL: " << std::hex << (int)index << std::endl;
        directPass = false;
        pass = false;
    }
    // Index high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    index = Board.GetEncoderIndex();
    if ((index&enc_mask) != enc_mask) {
        logFile << "   Setting index = 1, FAIL: " << std::hex << (int)index << std::endl;
        directPass = false;
        pass = false;
    }

    if (directPass)
        Amp1394Console::Print(curLine++, 49, "- PASS");
    else
        Amp1394Console::Print(curLine++, 49, "- FAIL");

    if (pass)
        logFile << "   Overall result: PASS" << std::endl;
    else
        logFile << "   Overall result: FAIL" << std::endl;
    return pass;
}